

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLWriter.cxx
# Opt level: O0

void __thiscall cmXMLWriter::cmXMLWriter(cmXMLWriter *this,ostream *output,size_t level)

{
  allocator<char> local_21;
  size_t local_20;
  size_t level_local;
  ostream *output_local;
  cmXMLWriter *this_local;
  
  this->Output = output;
  local_20 = level;
  level_local = (size_t)output;
  output_local = (ostream *)this;
  std::
  stack<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::stack<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void>
            ((stack<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&this->Elements);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->IndentationElement,1,'\t',&local_21);
  std::allocator<char>::~allocator(&local_21);
  this->Level = local_20;
  this->Indent = 0;
  this->ElementOpen = false;
  this->BreakAttrib = false;
  this->IsContent = false;
  return;
}

Assistant:

cmXMLWriter::cmXMLWriter(std::ostream& output, std::size_t level)
  : Output(output)
  , IndentationElement(1, '\t')
  , Level(level)
  , Indent(0)
  , ElementOpen(false)
  , BreakAttrib(false)
  , IsContent(false)
{
}